

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

CURLcode Curl_http2_switched(Curl_easy *data,char *mem,size_t nread)

{
  anon_union_248_5_a113b5f6_for_proto *settings_payload;
  connectdata *conn;
  HTTP *pHVar1;
  Curl_send *pCVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *fmt;
  CURLcode result;
  CURLcode local_44;
  http_conn *local_40;
  char *local_38;
  
  conn = data->conn;
  pHVar1 = (data->req).p.http;
  local_44 = Curl_http2_setup(data,conn);
  if (local_44 != CURLE_OK) {
    return local_44;
  }
  settings_payload = &conn->proto;
  pCVar2 = conn->send[0];
  (conn->proto).ftpc.pp.sendbuf.toobig = (size_t)conn->recv[0];
  (conn->proto).ftpc.pp.sendbuf.allc = (size_t)pCVar2;
  conn->recv[0] = http2_recv;
  conn->send[0] = http2_send;
  local_38 = mem;
  if ((data->req).upgr101 == UPGR101_RECEIVED) {
    pHVar1->stream_id = 1;
    uVar3 = nghttp2_session_upgrade2
                      ((conn->proto).httpc.h2,(uint8_t *)settings_payload,(conn->proto).httpc.binlen
                       ,(uint)((data->state).httpreq == '\x05'),(void *)0x0);
    if (uVar3 != 0) {
      pcVar5 = nghttp2_strerror(uVar3);
      fmt = "nghttp2_session_upgrade2() failed: %s(%d)";
      goto LAB_0010b588;
    }
    local_40 = (http_conn *)settings_payload;
    iVar4 = nghttp2_session_set_stream_user_data((conn->proto).httpc.h2,pHVar1->stream_id,data);
    if (iVar4 != 0) {
      Curl_infof(data,"http/2: failed to set user_data for stream %u",(ulong)(uint)pHVar1->stream_id
                );
    }
  }
  else {
    (conn->proto).ftpc.cwdcount = 3;
    local_40 = (http_conn *)settings_payload;
    uVar3 = Curl_multi_max_concurrent_streams(data->multi);
    (conn->proto).httpc.local_settings[0].value = uVar3;
    (conn->proto).ftpc.newhost = (char *)0x200000000000004;
    (conn->proto).httpc.local_settings[2].settings_id = 2;
    *(uint *)((long)&conn->proto + 0xbc) = (uint)(data->multi->push_cb != (curl_push_callback)0x0);
    (conn->proto).httpc.local_settings_num = 3;
    pHVar1->stream_id = -1;
    uVar3 = nghttp2_submit_settings
                      ((conn->proto).httpc.h2,'\0',(conn->proto).httpc.local_settings,
                       (conn->proto).httpc.local_settings_num);
    if (uVar3 != 0) {
      pcVar5 = nghttp2_strerror(uVar3);
      fmt = "nghttp2_submit_settings() failed: %s(%d)";
      goto LAB_0010b588;
    }
  }
  uVar3 = nghttp2_session_set_local_window_size((conn->proto).httpc.h2,'\0',0,0x2000000);
  if (uVar3 == 0) {
    if (0x8000 < nread) {
      Curl_failf(data,
                 "connection buffer size is too small to store data following HTTP Upgrade response header: buflen=%d, datalen=%zu"
                 ,0x8000,nread);
      return CURLE_HTTP2;
    }
    Curl_infof(data,
               "Copying HTTP/2 data in stream buffer to connection buffer after upgrade: len=%zu",
               nread);
    if (nread != 0) {
      memcpy((conn->proto).ftpc.pp.statemachine,local_38,nread);
    }
    (conn->proto).httpc.inbuflen = nread;
    iVar4 = h2_process_pending_input(data,local_40,&local_44);
    return (uint)(iVar4 == -1) << 4;
  }
  pcVar5 = nghttp2_strerror(uVar3);
  fmt = "nghttp2_session_set_local_window_size() failed: %s(%d)";
LAB_0010b588:
  Curl_failf(data,fmt,pcVar5,(ulong)uVar3);
  return CURLE_HTTP2;
}

Assistant:

CURLcode Curl_http2_switched(struct Curl_easy *data,
                             const char *mem, size_t nread)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  struct http_conn *httpc = &conn->proto.httpc;
  int rv;
  struct HTTP *stream = data->req.p.http;

  result = Curl_http2_setup(data, conn);
  if(result)
    return result;

  httpc->recv_underlying = conn->recv[FIRSTSOCKET];
  httpc->send_underlying = conn->send[FIRSTSOCKET];
  conn->recv[FIRSTSOCKET] = http2_recv;
  conn->send[FIRSTSOCKET] = http2_send;

  if(data->req.upgr101 == UPGR101_RECEIVED) {
    /* stream 1 is opened implicitly on upgrade */
    stream->stream_id = 1;
    /* queue SETTINGS frame (again) */
    rv = nghttp2_session_upgrade2(httpc->h2, httpc->binsettings, httpc->binlen,
                                  data->state.httpreq == HTTPREQ_HEAD, NULL);
    if(rv) {
      failf(data, "nghttp2_session_upgrade2() failed: %s(%d)",
            nghttp2_strerror(rv), rv);
      return CURLE_HTTP2;
    }

    rv = nghttp2_session_set_stream_user_data(httpc->h2,
                                              stream->stream_id,
                                              data);
    if(rv) {
      infof(data, "http/2: failed to set user_data for stream %u",
            stream->stream_id);
      DEBUGASSERT(0);
    }
  }
  else {
    populate_settings(data, httpc);

    /* stream ID is unknown at this point */
    stream->stream_id = -1;
    rv = nghttp2_submit_settings(httpc->h2, NGHTTP2_FLAG_NONE,
                                 httpc->local_settings,
                                 httpc->local_settings_num);
    if(rv) {
      failf(data, "nghttp2_submit_settings() failed: %s(%d)",
            nghttp2_strerror(rv), rv);
      return CURLE_HTTP2;
    }
  }

  rv = nghttp2_session_set_local_window_size(httpc->h2, NGHTTP2_FLAG_NONE, 0,
                                             HTTP2_HUGE_WINDOW_SIZE);
  if(rv) {
    failf(data, "nghttp2_session_set_local_window_size() failed: %s(%d)",
          nghttp2_strerror(rv), rv);
    return CURLE_HTTP2;
  }

  /* we are going to copy mem to httpc->inbuf.  This is required since
     mem is part of buffer pointed by stream->mem, and callbacks
     called by nghttp2_session_mem_recv() will write stream specific
     data into stream->mem, overwriting data already there. */
  if(H2_BUFSIZE < nread) {
    failf(data, "connection buffer size is too small to store data following "
          "HTTP Upgrade response header: buflen=%d, datalen=%zu",
          H2_BUFSIZE, nread);
    return CURLE_HTTP2;
  }

  infof(data, "Copying HTTP/2 data in stream buffer to connection buffer"
        " after upgrade: len=%zu",
        nread);

  if(nread)
    memcpy(httpc->inbuf, mem, nread);

  httpc->inbuflen = nread;

  DEBUGASSERT(httpc->nread_inbuf == 0);

  if(-1 == h2_process_pending_input(data, httpc, &result))
    return CURLE_HTTP2;

  return CURLE_OK;
}